

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_writer.cpp
# Opt level: O0

void __thiscall
embree::XMLWriter::store(XMLWriter *this,Ref<embree::SceneGraph::HairSetNode> *mesh,ssize_t id)

{
  uint uVar1;
  ulong uVar2;
  bool bVar3;
  runtime_error *this_00;
  size_type sVar4;
  reference pvVar5;
  uint *puVar6;
  size_t sVar7;
  int __oflag;
  int __oflag_00;
  undefined8 in_RDX;
  long *in_RSI;
  XMLWriter *in_RDI;
  Ref<embree::SceneGraph::MaterialNode> *in_stack_00000050;
  XMLWriter *in_stack_00000058;
  vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_> *p_1;
  iterator __end2;
  iterator __begin2;
  vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
  *__range2;
  vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_> *p;
  iterator __end1;
  iterator __begin1;
  vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
  *__range1;
  size_t i;
  vector<int,_std::allocator<int>_> hairid;
  vector<int,_std::allocator<int>_> indices;
  string str_subtype;
  string str_type;
  vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
  *in_stack_fffffffffffffbe8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffbf0;
  allocator *paVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffbf8;
  XMLWriter *in_stack_fffffffffffffc00;
  size_type in_stack_fffffffffffffc08;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffc10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc30;
  char *in_stack_fffffffffffffc38;
  allocator local_2d9;
  string local_2d8 [39];
  undefined1 local_2b1 [33];
  reference local_290;
  vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_> *local_288;
  __normal_iterator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_*,_std::vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>_>
  local_280;
  long local_278;
  allocator local_269;
  string local_268 [39];
  allocator local_241;
  string local_240 [32];
  reference local_220;
  vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_> *local_218;
  __normal_iterator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_*,_std::vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>_>
  local_210;
  long local_208;
  allocator local_1f9;
  string local_1f8 [32];
  long *local_1d8;
  string local_1d0 [32];
  string local_1b0 [32];
  string local_190 [32];
  string local_170 [32];
  ulong local_150;
  vector<int,_std::allocator<int>_> local_140;
  vector<int,_std::allocator<int>_> local_120;
  allocator local_101;
  string local_100 [55];
  allocator local_c9;
  string local_c8 [32];
  undefined8 local_a8;
  long *local_90;
  long **local_88;
  long **local_80;
  
  local_a8 = in_RDX;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c8,"",&local_c9);
  std::allocator<char>::~allocator((allocator<char> *)&local_c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_100,"",&local_101);
  std::allocator<char>::~allocator((allocator<char> *)&local_101);
  switch(*(undefined4 *)(*in_RSI + 0x70)) {
  case 0x11:
    std::__cxx11::string::operator=(local_c8,"linear");
    std::__cxx11::string::operator=(local_100,"flat");
    break;
  default:
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"invalid curve type");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  case 0x18:
    std::__cxx11::string::operator=(local_c8,"bezier");
    std::__cxx11::string::operator=(local_100,"round");
    break;
  case 0x19:
    std::__cxx11::string::operator=(local_c8,"bezier");
    std::__cxx11::string::operator=(local_100,"flat");
    break;
  case 0x1a:
    std::__cxx11::string::operator=(local_c8,"bezier");
    std::__cxx11::string::operator=(local_100,"oriented");
    break;
  case 0x20:
    std::__cxx11::string::operator=(local_c8,"bspline");
    std::__cxx11::string::operator=(local_100,"round");
    break;
  case 0x21:
    std::__cxx11::string::operator=(local_c8,"bspline");
    std::__cxx11::string::operator=(local_100,"flat");
    break;
  case 0x22:
    std::__cxx11::string::operator=(local_c8,"bspline");
    std::__cxx11::string::operator=(local_100,"oriented");
  }
  std::
  vector<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
  ::size((vector<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
          *)(*in_RSI + 0xd8));
  std::allocator<int>::allocator((allocator<int> *)0x406efc);
  std::vector<int,_std::allocator<int>_>::vector
            (in_stack_fffffffffffffc10,in_stack_fffffffffffffc08,
             (allocator_type *)in_stack_fffffffffffffc00);
  std::allocator<int>::~allocator((allocator<int> *)0x406f28);
  std::
  vector<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
  ::size((vector<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
          *)(*in_RSI + 0xd8));
  std::allocator<int>::allocator((allocator<int> *)0x406f7c);
  std::vector<int,_std::allocator<int>_>::vector
            (in_stack_fffffffffffffc10,in_stack_fffffffffffffc08,
             (allocator_type *)in_stack_fffffffffffffc00);
  std::allocator<int>::~allocator((allocator<int> *)0x406fa8);
  local_150 = 0;
  while( true ) {
    uVar2 = local_150;
    sVar4 = std::
            vector<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
            ::size((vector<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
                    *)(*in_RSI + 0xd8));
    if (sVar4 <= uVar2) break;
    pvVar5 = std::
             vector<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
             ::operator[]((vector<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
                           *)(*in_RSI + 0xd8),local_150);
    uVar1 = pvVar5->vertex;
    puVar6 = (uint *)std::vector<int,_std::allocator<int>_>::operator[](&local_120,local_150);
    *puVar6 = uVar1;
    pvVar5 = std::
             vector<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
             ::operator[]((vector<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
                           *)(*in_RSI + 0xd8),local_150);
    uVar1 = pvVar5->id;
    puVar6 = (uint *)std::vector<int,_std::allocator<int>_>::operator[](&local_140,local_150);
    *puVar6 = uVar1;
    local_150 = local_150 + 1;
  }
  std::operator+(in_stack_fffffffffffffc38,in_stack_fffffffffffffc30);
  std::operator+(in_stack_fffffffffffffbf8,(char *)in_stack_fffffffffffffbf0);
  std::operator+(in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0);
  std::operator+(in_stack_fffffffffffffbf8,(char *)in_stack_fffffffffffffbf0);
  open(in_RDI,(char *)local_170,(int)local_a8);
  std::__cxx11::string::~string(local_170);
  std::__cxx11::string::~string(local_190);
  std::__cxx11::string::~string(local_1b0);
  std::__cxx11::string::~string(local_1d0);
  local_90 = (long *)(*in_RSI + 0x108);
  local_88 = &local_1d8;
  local_1d8 = (long *)*local_90;
  if (local_1d8 != (long *)0x0) {
    (**(code **)(*local_1d8 + 0x10))();
  }
  store(in_stack_00000058,in_stack_00000050);
  local_80 = &local_1d8;
  if (local_1d8 != (long *)0x0) {
    (**(code **)(*local_1d8 + 0x18))();
  }
  sVar7 = SceneGraph::HairSetNode::numTimeSteps((HairSetNode *)0x40733d);
  if (sVar7 != 1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1f8,"animated_positions",&local_1f9);
    open(in_RDI,(char *)local_1f8,__oflag);
    std::__cxx11::string::~string(local_1f8);
    std::allocator<char>::~allocator((allocator<char> *)&local_1f9);
  }
  local_208 = *in_RSI + 0x78;
  local_210._M_current =
       (vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_> *)
       std::
       vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
       ::begin((vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                *)in_stack_fffffffffffffbe8);
  local_218 = (vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_> *)
              std::
              vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
              ::end((vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                     *)in_stack_fffffffffffffbe8);
  while (bVar3 = __gnu_cxx::operator!=
                           ((__normal_iterator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_*,_std::vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>_>
                             *)in_stack_fffffffffffffbf0,
                            (__normal_iterator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_*,_std::vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>_>
                             *)in_stack_fffffffffffffbe8), bVar3) {
    local_220 = __gnu_cxx::
                __normal_iterator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_*,_std::vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>_>
                ::operator*(&local_210);
    store(in_stack_fffffffffffffc00,(char *)in_stack_fffffffffffffbf8,
          (avector<Vec3ff> *)in_stack_fffffffffffffbf0);
    __gnu_cxx::
    __normal_iterator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_*,_std::vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>_>
    ::operator++(&local_210);
  }
  sVar7 = SceneGraph::HairSetNode::numTimeSteps((HairSetNode *)0x4075d1);
  if (sVar7 != 1) {
    paVar8 = &local_241;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_240,"animated_positions",paVar8);
    close(in_RDI,(int)local_240);
    std::__cxx11::string::~string(local_240);
    std::allocator<char>::~allocator((allocator<char> *)&local_241);
  }
  sVar4 = std::
          vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
          ::size((vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                  *)(*in_RSI + 0x90));
  if (sVar4 != 0) {
    sVar7 = SceneGraph::HairSetNode::numTimeSteps((HairSetNode *)0x4076f5);
    if (sVar7 != 1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_268,"animated_normals",&local_269);
      open(in_RDI,(char *)local_268,__oflag_00);
      std::__cxx11::string::~string(local_268);
      std::allocator<char>::~allocator((allocator<char> *)&local_269);
    }
    local_278 = *in_RSI + 0x90;
    local_280._M_current =
         (vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_> *)
         std::
         vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
         ::begin(in_stack_fffffffffffffbe8);
    local_288 = (vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_> *)
                std::
                vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                ::end(in_stack_fffffffffffffbe8);
    while (bVar3 = __gnu_cxx::operator!=
                             ((__normal_iterator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_*,_std::vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>_>
                               *)in_stack_fffffffffffffbf0,
                              (__normal_iterator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_*,_std::vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>_>
                               *)in_stack_fffffffffffffbe8), bVar3) {
      local_290 = __gnu_cxx::
                  __normal_iterator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_*,_std::vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>_>
                  ::operator*(&local_280);
      store(in_stack_fffffffffffffc00,(char *)in_stack_fffffffffffffbf8,
            (avector<Vec3fa> *)in_stack_fffffffffffffbf0);
      __gnu_cxx::
      __normal_iterator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_*,_std::vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>_>
      ::operator++(&local_280);
    }
    in_stack_fffffffffffffc00 =
         (XMLWriter *)SceneGraph::HairSetNode::numTimeSteps((HairSetNode *)0x40789a);
    if (in_stack_fffffffffffffc00 != (XMLWriter *)0x1) {
      in_stack_fffffffffffffbf8 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2b1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)(local_2b1 + 1),"animated_normals",(allocator *)in_stack_fffffffffffffbf8
                );
      close(in_RDI,(int)local_2b1 + 1);
      std::__cxx11::string::~string((string *)(local_2b1 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_2b1);
    }
  }
  store<int>(in_stack_fffffffffffffc00,(char *)in_stack_fffffffffffffbf8,
             (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffbf0);
  store<int>(in_stack_fffffffffffffc00,(char *)in_stack_fffffffffffffbf8,
             (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffbf0);
  paVar8 = &local_2d9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2d8,"Curves",paVar8);
  close(in_RDI,(int)local_2d8);
  std::__cxx11::string::~string(local_2d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2d9);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffc00);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffc00);
  std::__cxx11::string::~string(local_100);
  std::__cxx11::string::~string(local_c8);
  return;
}

Assistant:

void XMLWriter::store(Ref<SceneGraph::HairSetNode> mesh, ssize_t id)
  {
    std::string str_type = "";
    std::string str_subtype = "";

    switch (mesh->type) {
    case RTC_GEOMETRY_TYPE_FLAT_LINEAR_CURVE:
      str_type = "linear";
      str_subtype = "flat";
      break;

    case RTC_GEOMETRY_TYPE_ROUND_BEZIER_CURVE:
      str_type = "bezier";
      str_subtype = "round";
      break;

    case RTC_GEOMETRY_TYPE_FLAT_BEZIER_CURVE:
      str_type = "bezier";
      str_subtype = "flat";
      break;

    case RTC_GEOMETRY_TYPE_NORMAL_ORIENTED_BEZIER_CURVE:
      str_type = "bezier";
      str_subtype = "oriented";
      break;

    case RTC_GEOMETRY_TYPE_ROUND_BSPLINE_CURVE:
      str_type = "bspline";
      str_subtype = "round";
      break;

    case RTC_GEOMETRY_TYPE_FLAT_BSPLINE_CURVE:
      str_type = "bspline";
      str_subtype = "flat";
      break;

    case RTC_GEOMETRY_TYPE_NORMAL_ORIENTED_BSPLINE_CURVE:
      str_type = "bspline";
      str_subtype = "oriented";
      break;

    default:
      throw std::runtime_error("invalid curve type");
    }

    std::vector<int> indices(mesh->hairs.size());
    std::vector<int> hairid(mesh->hairs.size());
    for (size_t i=0; i<mesh->hairs.size(); i++) {
      indices[i] = mesh->hairs[i].vertex;
      hairid[i] = mesh->hairs[i].id;
    }
    
    open("Curves type=\""+str_subtype+"\" basis=\""+str_type+"\"",id);
    store(mesh->material);
    if (mesh->numTimeSteps() != 1) open("animated_positions");
    for (const auto& p : mesh->positions) store("positions",p);
    if (mesh->numTimeSteps() != 1) close("animated_positions");
    if (mesh->normals.size()) {
      if (mesh->numTimeSteps() != 1) open("animated_normals");
      for (const auto& p : mesh->normals) store("normals",p);
      if (mesh->numTimeSteps() != 1) close("animated_normals");
    }
    store("indices",indices);
    store("hairid",hairid);
    close("Curves");
  }